

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.h
# Opt level: O3

void uWS::Loop::preCb(us_loop_t *loop)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  
  lVar1 = us_loop_ext();
  for (p_Var2 = *(_Rb_tree_node_base **)(lVar1 + 0xa8);
      p_Var2 != (_Rb_tree_node_base *)(lVar1 + 0x98);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    (*(code *)p_Var2[2]._M_parent)(&p_Var2[1]._M_left,0x10,loop);
  }
  return;
}

Assistant:

static void preCb(us_loop_t *loop) {
        LoopData *loopData = (LoopData *) us_loop_ext(loop);

        for (auto &p : loopData->preHandlers) {
            p.second((Loop *) loop);
        }
    }